

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::SListLeaf::insert
          (SListLeaf *this,LeafData *ld)

{
  Rhs RStack_58;
  
  Inferences::ALASCA::SuperpositionConf::Rhs::Rhs(&RStack_58,ld);
  Lib::
  SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
  ::insert(&this->_children,&RStack_58);
  return;
}

Assistant:

void insert(LeafData ld) override { _children.insert(ld); }